

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtVM.c
# Opt level: O1

newtRef NcSendWithArgArray(newtRefArg receiver,newtRefArg sym,_Bool ignore,newtRefArg args)

{
  _Bool _Var1;
  newtRef nVar2;
  newtRef inFunction;
  int32_t err;
  
  _Var1 = NewtRefIsSymbol(sym);
  if (_Var1) {
    _Var1 = NewtRefIsFrame(receiver);
    if ((_Var1) || (_Var1 = NewtRefIsNIL(receiver), _Var1)) {
      nVar2 = NcFullLookupFrame(receiver,sym);
      if (nVar2 != 0xfff2) {
        inFunction = NsGetSlot(2,nVar2,sym);
        nVar2 = NVMMessageSendWithArgArray(nVar2,receiver,inFunction,args);
        return nVar2;
      }
      if (ignore) {
        return 0xfff2;
      }
      err = -0xbea9;
      receiver = sym;
    }
    else {
      err = -0xbd10;
    }
  }
  else {
    err = -0xbd1a;
    receiver = sym;
  }
  nVar2 = NewtThrow(err,receiver);
  return nVar2;
}

Assistant:

newtRef NcSendWithArgArray(newtRefArg receiver, newtRefArg sym, bool ignore, newtRefArg args)
{
    newtRefVar	result = kNewtRefUnbind;
    newtRefVar	impl;
    newtRefVar	fn;

    if (! NewtRefIsSymbol(sym))
    {
        return NewtThrow(kNErrNotASymbol, sym);
    }

    if (! NewtRefIsFrame(receiver) && ! NewtRefIsNIL(receiver))
    {
        return NewtThrow(kNErrNotAFrame, receiver);
    }

    impl = NcFullLookupFrame(receiver, sym);

    if (impl != kNewtRefUnbind)
    {
        fn = NcGetSlot(impl, sym);
        result = NVMMessageSendWithArgArray(impl, receiver, fn, args);
    }
    else
    {
        if (! ignore)
            return NewtThrow(kNErrUndefinedMethod, sym);
    }

    return result;
}